

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void custom_compare_primitive_test(void)

{
  double dVar1;
  fdb_status fVar2;
  size_t sVar3;
  long in_RCX;
  ulong uVar4;
  long lVar5;
  code *__src;
  char *__format;
  fdb_doc **doc;
  double dVar6;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_doc *local_3d8;
  fdb_kvs_handle *local_3d0;
  double local_3c8;
  fdb_kvs_handle *local_3c0;
  fdb_file_handle *local_3b8;
  timeval local_3b0;
  fdb_kvs_config local_3a0;
  fdb_doc *local_388 [10];
  double local_338 [33];
  fdb_config local_230;
  char local_138 [264];
  
  uVar4 = 0;
  gettimeofday(&local_3b0,(__timezone_ptr_t)0x0);
  memleak_start();
  local_3d8 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.multi_kv_instances = true;
  local_3a0.custom_cmp = _cmp_double;
  fdb_open(&local_3b8,"./dummy1",&local_230);
  fdb_kvs_open_default(local_3b8,&local_3c0,&local_3a0);
  __src = logCallbackFunc;
  fVar2 = fdb_set_log_callback(local_3c0,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00114d94;
  doc = local_388;
  lVar5 = 0;
  do {
    dVar6 = 10000.0 / (double)(int)lVar5;
    local_338[0] = dVar6;
    sprintf(local_138,"value: %d, %f",dVar6,uVar4);
    sVar3 = strlen(local_138);
    fdb_doc_create(doc,local_338,8,(void *)0x0,0,local_138,sVar3 + 1);
    fdb_set(local_3c0,*doc);
    lVar5 = lVar5 + 0xb;
    uVar4 = (ulong)((int)uVar4 + 1);
    doc = doc + 1;
  } while (lVar5 != 0x6e);
  in_RCX = 0;
  local_3c8 = dVar6;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d0,(void *)0x0,0,(void *)0x0,0,0);
  dVar6 = -1.0;
  do {
    __src = (code *)&local_3d8;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_3d0,&local_3d8);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00114d7b:
      custom_compare_primitive_test();
      goto LAB_00114d80;
    }
    __src = (code *)local_3d8->key;
    memcpy(&local_3c8,__src,local_3d8->keylen);
    dVar1 = local_3c8;
    if (local_3c8 <= dVar6) {
      custom_compare_primitive_test();
      goto LAB_00114d7b;
    }
    fdb_doc_free(local_3d8);
    local_3d8 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_3d0);
    dVar6 = dVar1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)local_3d0);
  fdb_commit(local_3b8,'\x01');
  in_RCX = 0;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d0,(void *)0x0,0,(void *)0x0,0,0);
  dVar6 = -1.0;
  do {
    __src = (code *)&local_3d8;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_3d0,&local_3d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00114d85;
    __src = (code *)local_3d8->key;
    memcpy(&local_3c8,__src,local_3d8->keylen);
    dVar1 = local_3c8;
    if (local_3c8 <= dVar6) goto LAB_00114d80;
    fdb_doc_free(local_3d8);
    local_3d8 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_3d0);
    dVar6 = dVar1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)local_3d0);
  fdb_compact(local_3b8,"./dummy2");
  in_RCX = 0;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d0,(void *)0x0,0,(void *)0x0,0,0);
  dVar6 = -1.0;
  while (__src = (code *)&local_3d8, fVar2 = fdb_iterator_get((fdb_iterator *)local_3d0,&local_3d8),
        fVar2 == FDB_RESULT_SUCCESS) {
    __src = (code *)local_3d8->key;
    memcpy(&local_3c8,__src,local_3d8->keylen);
    dVar1 = local_3c8;
    if (local_3c8 <= dVar6) goto LAB_00114d8a;
    fdb_doc_free(local_3d8);
    local_3d8 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_3d0);
    dVar6 = dVar1;
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close((fdb_iterator *)local_3d0);
      fdb_kvs_close(local_3c0);
      fdb_close(local_3b8);
      lVar5 = 0;
      do {
        fdb_doc_free(local_388[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (custom_compare_primitive_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"custom compare function for primitive key test");
      return;
    }
  }
  goto LAB_00114d8f;
LAB_00114d80:
  custom_compare_primitive_test();
LAB_00114d85:
  custom_compare_primitive_test();
LAB_00114d8a:
  custom_compare_primitive_test();
LAB_00114d8f:
  custom_compare_primitive_test();
LAB_00114d94:
  custom_compare_primitive_test();
  if (((fdb_doc **)__src != (fdb_doc **)0x0) && (in_RCX == 0)) {
    return;
  }
  return;
}

Assistant:

void custom_compare_primitive_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    double key_double, key_double_prev;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    kvs_config.custom_cmp = _cmp_double;

    // open db with custom compare function for double key type
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_primitive_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        key_double = 10000/(i*11.0);
        memcpy(keybuf, &key_double, sizeof(key_double));
        sprintf(bodybuf, "value: %d, %f", i, key_double);
        fdb_doc_create(&doc[i], (void*)keybuf, sizeof(key_double), NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for primitive key test");
}